

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

real_t fast_mul_add(real_t x,real_t y,real_t z)

{
  real_t z_local;
  real_t y_local;
  real_t x_local;
  
  return x * y + z;
}

Assistant:

static inline real_t fast_mul_add(real_t x, real_t y, real_t z) {
#ifdef FAST_REAL_FMA
    // GCC has FP_FAST_FMA defined when a fast version of `fma()` is available
    return fma(x, y, z);
#else
    // clang supports the `STDC FP_CONTRACT` pragma
    // Other compilers may ignore it
#pragma STDC FP_CONTRACT ON
    return x * y + z;
#endif
}